

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

float_t __thiscall djb::microfacet::pdf(microfacet *this,vec3 *wi,vec3 *wo,void *user_args)

{
  long lVar1;
  args *paVar2;
  float_t fVar3;
  float extraout_XMM0_Da;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  args args;
  vec3 local_80;
  vec3 local_70;
  args local_64;
  
  fVar4 = wi->x + wo->x;
  fVar5 = wi->y + wo->y;
  fVar6 = wi->z + wo->z;
  fVar7 = fVar6 * fVar6 + fVar4 * fVar4 + fVar5 * fVar5;
  fVar3 = 0.0;
  if (0.0 < fVar7) {
    if (user_args == (void *)0x0) {
      local_80.x = 0.0;
      local_80.y = 0.0;
      local_80.z = 1.0;
      microfacet::args::normalmap(&local_64,&local_80,1.0,1.0,0.0);
    }
    else {
      paVar2 = &local_64;
      for (lVar1 = 0x13; lVar1 != 0; lVar1 = lVar1 + -1) {
        (paVar2->mtra).r[0].x = *user_args;
        user_args = (float_t *)((long)user_args + 4);
        paVar2 = (args *)&(paVar2->mtra).r[0].y;
      }
    }
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
    fVar7 = 1.0 / fVar7;
    local_70.z = fVar6 * fVar7;
    local_70.y = fVar5 * fVar7;
    local_70.x = fVar4 * fVar7;
    fVar3 = ndf(this,&local_70,&local_64);
    fVar7 = wi->x;
    fVar4 = wi->y;
    fVar5 = wi->z;
    fVar8 = local_64.minv.r[0].z * fVar5 +
            local_64.minv.r[0].x * fVar7 + local_64.minv.r[0].y * fVar4;
    fVar6 = local_64.minv.r[1].z * fVar5 +
            local_64.minv.r[1].x * fVar7 + local_64.minv.r[1].y * fVar4;
    fVar4 = fVar5 * local_64.minv.r[2].z +
            fVar7 * local_64.minv.r[2].x + fVar4 * local_64.minv.r[2].y;
    fVar7 = fVar4 * fVar4 + fVar8 * fVar8 + fVar6 * fVar6;
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
    fVar5 = 1.0 / fVar7;
    local_80.z = fVar4 * fVar5;
    local_80.y = fVar6 * fVar5;
    local_80.x = fVar8 * fVar5;
    (*(this->super_brdf)._vptr_brdf[10])(this);
    fVar3 = fVar3 / (extraout_XMM0_Da * fVar7 * 4.0);
  }
  return fVar3;
}

Assistant:

float_t
microfacet::pdf(const vec3 &wi, const vec3 &wo, const void *user_args) const
{
	vec3 tmp = wi + wo;
	float_t nrm = dot(tmp, tmp);

	if (/*wi.z > 0 &&*/ nrm > 0) {
		microfacet::args args =
			user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
			          : microfacet::args::standard();
		vec3 wh = tmp * inversesqrt(nrm);
		float_t D = ndf(wh, args);
		float_t s = sigma(wi, args);

		return (D / (4 * s));
	}

	return 0;
}